

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O1

void __thiscall cbtConvexHullInternal::Vertex::receiveNearbyFaces(Vertex *this,Vertex *src)

{
  Face *pFVar1;
  Face **ppFVar2;
  
  ppFVar2 = &this->lastNearbyFace->nextWithSameNearbyVertex;
  if (this->lastNearbyFace == (Face *)0x0) {
    ppFVar2 = &this->firstNearbyFace;
  }
  *ppFVar2 = src->firstNearbyFace;
  if (src->lastNearbyFace != (Face *)0x0) {
    this->lastNearbyFace = src->lastNearbyFace;
  }
  for (pFVar1 = src->firstNearbyFace; pFVar1 != (Face *)0x0;
      pFVar1 = pFVar1->nextWithSameNearbyVertex) {
    pFVar1->nearbyVertex = this;
  }
  src->firstNearbyFace = (Face *)0x0;
  src->lastNearbyFace = (Face *)0x0;
  return;
}

Assistant:

void receiveNearbyFaces(Vertex* src)
		{
			if (lastNearbyFace)
			{
				lastNearbyFace->nextWithSameNearbyVertex = src->firstNearbyFace;
			}
			else
			{
				firstNearbyFace = src->firstNearbyFace;
			}
			if (src->lastNearbyFace)
			{
				lastNearbyFace = src->lastNearbyFace;
			}
			for (Face* f = src->firstNearbyFace; f; f = f->nextWithSameNearbyVertex)
			{
				cbtAssert(f->nearbyVertex == src);
				f->nearbyVertex = this;
			}
			src->firstNearbyFace = NULL;
			src->lastNearbyFace = NULL;
		}